

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr
htmlCtxtReadMemory(htmlParserCtxtPtr ctxt,char *buffer,int size,char *URL,char *encoding,int options
                  )

{
  xmlParserInputPtr input_00;
  xmlParserInputPtr input;
  int options_local;
  char *encoding_local;
  char *URL_local;
  int size_local;
  char *buffer_local;
  htmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (size < 0)) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt,options);
    input_00 = xmlCtxtNewInputFromMemory(ctxt,URL,buffer,(long)size,encoding,XML_INPUT_BUF_STATIC);
    if (input_00 == (xmlParserInputPtr)0x0) {
      ctxt_local = (htmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (htmlParserCtxtPtr)htmlCtxtParseDocument(ctxt,input_00);
    }
  }
  return (htmlDocPtr)ctxt_local;
}

Assistant:

htmlDocPtr
htmlCtxtReadMemory(htmlParserCtxtPtr ctxt, const char *buffer, int size,
                  const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (size < 0))
        return (NULL);

    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromMemory(ctxt, URL, buffer, size, encoding,
                                      XML_INPUT_BUF_STATIC);
    if (input == NULL)
        return(NULL);

    return(htmlCtxtParseDocument(ctxt, input));
}